

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O2

void ht_file_dump_listener_destroy(HT_FileDumpListener *listener)

{
  if (listener != (HT_FileDumpListener *)0x0) {
    if (listener->p_file != (FILE *)0x0) {
      ht_file_dump_listener_stop(listener);
    }
    ht_mutex_destroy(listener->mtx);
    ht_free(listener);
    return;
  }
  return;
}

Assistant:

void
ht_file_dump_listener_destroy(HT_FileDumpListener* listener)
{
    if (listener == NULL)
    {
        return;
    }

    if (!_ht_file_dump_listener_is_stopped(listener))
    {
        ht_file_dump_listener_stop(listener);
    }

    ht_mutex_destroy(listener->mtx);
    ht_free(listener);
}